

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O3

Result __thiscall
spectest::CommandRunner::ReadInvalidTextModule
          (CommandRunner *this,string_view module_filename,string *header)

{
  _Head_base<0UL,_wabt::Module_*,_false> _Var1;
  Result RVar2;
  string_view filename;
  string_view filename_00;
  WastParseOptions options;
  Errors errors;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastLexer *local_80;
  WastParseOptions local_78;
  undefined1 local_68 [24];
  _Head_base<0UL,_wabt::Module_*,_false> local_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  filename_00.size_ = (wabt *)module_filename.data_;
  local_48 = (char *)0x0;
  pcStack_40 = (char *)0x0;
  local_38 = (char *)0x0;
  filename.size_ = (size_type)&local_48;
  filename.data_ = (char *)module_filename.size_;
  RVar2 = wabt::ReadFile(filename_00.size_,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  filename_00.data_ = (char *)&local_80;
  wabt::WastLexer::CreateBufferLexer(filename_00,(char *)module_filename.size_,(size_t)local_48);
  local_68._16_8_ = (pointer)0x0;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = (pointer)0x0;
  if (RVar2.enum_ == Ok) {
    local_50._M_head_impl = (Module *)0x0;
    local_78.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_78.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_78.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_78.features.gc_enabled_ = s_features.gc_enabled_;
    local_78.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_78.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_78.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_78.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_78.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_78.features.simd_enabled_ = s_features.simd_enabled_;
    local_78.features.threads_enabled_ = s_features.threads_enabled_;
    local_78.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_78.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_78.debug_parsing = false;
    RVar2 = wabt::ParseWatModule
                      (local_80,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                                &local_50,(Errors *)local_68,&local_78);
    _Var1._M_head_impl = local_50._M_head_impl;
    if (local_50._M_head_impl != (Module *)0x0) {
      wabt::Module::~Module(local_50._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
  }
  wabt::WastLexer::MakeLineFinder((WastLexer *)&local_78);
  wabt::FormatErrorsToFile
            ((Errors *)local_68,Text,
             (LexerSourceLineFinder *)CONCAT35(local_78.features._5_3_,local_78.features._0_5_),
             _stdout,header,Once,0x50);
  if ((LexerSourceLineFinder *)CONCAT35(local_78.features._5_3_,local_78.features._0_5_) !=
      (LexerSourceLineFinder *)0x0) {
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)&local_78,
               (LexerSourceLineFinder *)CONCAT35(local_78.features._5_3_,local_78.features._0_5_));
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)local_68);
  if (local_80 != (WastLexer *)0x0) {
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)&local_80,local_80);
  }
  if (local_48 != (char *)0x0) {
    operator_delete(local_48);
  }
  return (Result)RVar2.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadInvalidTextModule(string_view module_filename,
                                            const std::string& header) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size());
  Errors errors;
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}